

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prod_tests1.cpp
# Opt level: O0

void __thiscall
test::prod_test::iu_PeepClassTest_x_iutest_x_PeepObject2_Test::
iu_PeepClassTest_x_iutest_x_PeepObject2_Test(iu_PeepClassTest_x_iutest_x_PeepObject2_Test *this)

{
  iu_PeepClassTest_x_iutest_x_PeepObject2_Test *this_local;
  
  iutest::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__iu_PeepClassTest_x_iutest_x_PeepObject2_Test_00623760;
  return;
}

Assistant:

IUTEST(PeepClassTest, PeepObject2)
{
    IUTEST_PEEP(ProdClass2, m_x) prod_class2_x(&s_prod2);
    prod_class2_x = 54;
    IUTEST_EXPECT_EQ(54, s_prod2.GetX());
    prod_class2_x += prod_class2_x;
    IUTEST_EXPECT_EQ(108, s_prod2.GetX());

    IUTEST_EXPECT_EQ(108, prod_class2_x);
}